

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteBlock.cpp
# Opt level: O3

ByteBlock *
Js::ByteBlock::NewFromArena(ArenaAllocator *alloc,byte *initialContent,int initialContentSize)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ByteBlock *this;
  
  if (initialContentSize < 1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteBlock.cpp"
                                ,0x3c,"(initialContentSize > 0)","Must have valid data size");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  this = (ByteBlock *)new<Memory::ArenaAllocator>(0x10,alloc,0x364470);
  ByteBlock(this,initialContentSize,alloc);
  if (initialContent != (byte *)0x0) {
    js_memcpy_s((this->m_content).ptr,(ulong)this->m_contentSize,initialContent,
                (long)initialContentSize);
  }
  return this;
}

Assistant:

ByteBlock *ByteBlock::NewFromArena(ArenaAllocator *alloc, const byte * initialContent, int initialContentSize)
    {
        // initialContent may be 'null' if no data to copy
        AssertMsg(initialContentSize > 0, "Must have valid data size");

        ByteBlock *newBlock = Anew(alloc, ByteBlock, initialContentSize, alloc);

        //
        // Copy any optional data into the block:
        // - If initialContent was not provided, the block's contents will be uninitialized.
        //
        if (initialContent != nullptr)
        {
            js_memcpy_s(newBlock->m_content, newBlock->GetLength(), initialContent, initialContentSize);
        }

        return newBlock;
    }